

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

char * c4::yml::NodeType::type_str(NodeType_e ty)

{
  NodeType_e ty_local;
  char *local_8;
  
  switch((uint)ty & 0xfff) {
  case 0:
    local_8 = "NOTYPE";
    break;
  case 1:
    local_8 = "VAL";
    break;
  case 2:
    local_8 = "KEY";
    break;
  case 3:
    local_8 = "KEYVAL";
    break;
  case 4:
    local_8 = "MAP";
    break;
  default:
    if ((ty & KEYVAL) == KEYVAL) {
      local_8 = "KEYVAL***";
    }
    else if ((ty & KEYMAP) == KEYMAP) {
      local_8 = "KEYMAP***";
    }
    else if ((ty & KEYSEQ) == KEYSEQ) {
      local_8 = "KEYSEQ***";
    }
    else if ((ty & DOCSEQ) == DOCSEQ) {
      local_8 = "DOCSEQ***";
    }
    else if ((ty & DOCMAP) == DOCMAP) {
      local_8 = "DOCMAP***";
    }
    else if ((ty & DOCVAL) == DOCVAL) {
      local_8 = "DOCVAL***";
    }
    else if ((ty & KEY) == NOTYPE) {
      if ((ty & VAL) == NOTYPE) {
        if ((ty & MAP) == NOTYPE) {
          if ((ty & SEQ) == NOTYPE) {
            if ((ty & DOC) == NOTYPE) {
              local_8 = "(unk)";
            }
            else {
              local_8 = "DOC***";
            }
          }
          else {
            local_8 = "SEQ***";
          }
        }
        else {
          local_8 = "MAP***";
        }
      }
      else {
        local_8 = "VAL***";
      }
    }
    else {
      local_8 = "KEY***";
    }
    break;
  case 6:
    local_8 = "KEYMAP";
    break;
  case 8:
    local_8 = "SEQ";
    break;
  case 10:
    local_8 = "KEYSEQ";
    break;
  case 0x10:
    local_8 = "DOC";
    break;
  case 0x11:
    local_8 = "DOCVAL";
    break;
  case 0x14:
    local_8 = "DOCMAP";
    break;
  case 0x18:
    local_8 = "DOCSEQ";
    break;
  case 0x28:
    local_8 = "STREAM";
  }
  return local_8;
}

Assistant:

const char* NodeType::type_str(NodeType_e ty)
{
    switch(ty & _TYMASK)
    {
    case KEYVAL:
        return "KEYVAL";
    case KEY:
        return "KEY";
    case VAL:
        return "VAL";
    case MAP:
        return "MAP";
    case SEQ:
        return "SEQ";
    case KEYMAP:
        return "KEYMAP";
    case KEYSEQ:
        return "KEYSEQ";
    case DOCSEQ:
        return "DOCSEQ";
    case DOCMAP:
        return "DOCMAP";
    case DOCVAL:
        return "DOCVAL";
    case DOC:
        return "DOC";
    case STREAM:
        return "STREAM";
    case NOTYPE:
        return "NOTYPE";
    default:
        if((ty & KEYVAL) == KEYVAL)
            return "KEYVAL***";
        if((ty & KEYMAP) == KEYMAP)
            return "KEYMAP***";
        if((ty & KEYSEQ) == KEYSEQ)
            return "KEYSEQ***";
        if((ty & DOCSEQ) == DOCSEQ)
            return "DOCSEQ***";
        if((ty & DOCMAP) == DOCMAP)
            return "DOCMAP***";
        if((ty & DOCVAL) == DOCVAL)
            return "DOCVAL***";
        if(ty & KEY)
            return "KEY***";
        if(ty & VAL)
            return "VAL***";
        if(ty & MAP)
            return "MAP***";
        if(ty & SEQ)
            return "SEQ***";
        if(ty & DOC)
            return "DOC***";
        return "(unk)";
    }
}